

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFanout.c
# Opt level: O3

void Aig_ObjAddFanout(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pFanout)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *__ptr;
  uint uVar4;
  uint *puVar5;
  int iVar6;
  uint *puVar7;
  ulong uVar8;
  
  __ptr = p->pFanData;
  if (__ptr == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                  ,0x6e,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if ((((uint)pFanout | (uint)pObj) & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj) && !Aig_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                  ,0x6f,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar6 = pFanout->Id;
  if (iVar6 < 1) {
    __assert_fail("pFanout->Id > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                  ,0x70,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar3 = pObj->Id;
  uVar4 = p->nFansAlloc;
  uVar8 = (ulong)uVar4;
  if ((int)uVar4 <= iVar3 || (int)uVar4 <= iVar6) {
    if (iVar6 < iVar3) {
      iVar6 = iVar3;
    }
    uVar8 = (long)iVar6 * 2;
    __ptr = (int *)realloc(__ptr,(ulong)(uint)(iVar6 * 10) << 2);
    p->pFanData = __ptr;
    memset(__ptr + (long)p->nFansAlloc * 5,0,(uVar8 - (long)p->nFansAlloc) * 0x14);
    p->nFansAlloc = (int)uVar8;
    iVar3 = pObj->Id;
  }
  if ((iVar3 < (int)uVar8) && (iVar6 = pFanout->Id, iVar6 < (int)uVar8)) {
    if ((Aig_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe) == pObj) {
      uVar4 = 0;
    }
    else {
      uVar4 = 1;
      if ((Aig_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe) != pObj) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x150,"int Aig_ObjWhatFanin(Aig_Obj_t *, Aig_Obj_t *)");
      }
    }
    uVar1 = uVar4 + iVar6 * 2;
    iVar6 = iVar6 * 2 >> 1;
    puVar7 = (uint *)(__ptr + (long)(iVar6 * 5) + (ulong)uVar4 + 1);
    puVar5 = (uint *)(__ptr + (long)(iVar6 * 5) + (ulong)uVar4 + 3);
    iVar3 = iVar3 * 5;
    uVar4 = __ptr[iVar3];
    if (uVar4 == 0) {
      __ptr[iVar3] = uVar1;
    }
    else {
      uVar2 = __ptr[(long)(((int)uVar4 >> 1) * 5) + (ulong)(uVar4 & 1) + 1];
      if (__ptr[(long)(((int)uVar2 >> 1) * 5) + (ulong)(uVar2 & 1) + 3] != uVar4) {
        __assert_fail("*pNext == *pFirst",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                      ,0x87,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      *puVar7 = uVar2;
      puVar7 = (uint *)(__ptr + (long)(((int)uVar4 >> 1) * 5) + (ulong)(uVar4 & 1) + 1);
      *puVar5 = __ptr[iVar3];
      puVar5 = (uint *)(__ptr + (long)(((int)uVar2 >> 1) * 5) + (ulong)(uVar2 & 1) + 3);
    }
    *puVar7 = uVar1;
    *puVar5 = uVar1;
    return;
  }
  __assert_fail("pObj->Id < p->nFansAlloc && pFanout->Id < p->nFansAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                ,0x78,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_ObjAddFanout( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pFanout )
{
    int iFan, * pFirst, * pPrevC, * pNextC, * pPrev, * pNext;
    assert( p->pFanData );
    assert( !Aig_IsComplement(pObj) && !Aig_IsComplement(pFanout) );
    assert( pFanout->Id > 0 );
    if ( pObj->Id >= p->nFansAlloc || pFanout->Id >= p->nFansAlloc )
    {
        int nFansAlloc = 2 * Abc_MaxInt( pObj->Id, pFanout->Id ); 
        p->pFanData = ABC_REALLOC( int, p->pFanData, 5 * nFansAlloc );
        memset( p->pFanData + 5 * p->nFansAlloc, 0, sizeof(int) * 5 * (nFansAlloc - p->nFansAlloc) );
        p->nFansAlloc = nFansAlloc;
    }
    assert( pObj->Id < p->nFansAlloc && pFanout->Id < p->nFansAlloc );
    iFan   = Aig_FanoutCreate( pFanout->Id, Aig_ObjWhatFanin(pFanout, pObj) );
    pPrevC = Aig_FanoutPrev( p->pFanData, iFan );
    pNextC = Aig_FanoutNext( p->pFanData, iFan );
    pFirst = Aig_FanoutObj( p->pFanData, pObj->Id );
    if ( *pFirst == 0 )
    {
        *pFirst = iFan;
        *pPrevC = iFan;
        *pNextC = iFan;
    }
    else
    {
        pPrev = Aig_FanoutPrev( p->pFanData, *pFirst );
        pNext = Aig_FanoutNext( p->pFanData, *pPrev );
        assert( *pNext == *pFirst );
        *pPrevC = *pPrev;
        *pNextC = *pFirst;
        *pPrev  = iFan;
        *pNext  = iFan;
    }
}